

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Derive.cpp
# Opt level: O0

void __thiscall amrex::DeriveRec::buildBC3D(DeriveRec *this,DescriptorList *d_list)

{
  undefined1 auVar1 [16];
  ulong __n;
  StateDescriptor *this_00;
  BCRec *pBVar2;
  long in_RDI;
  int j_1;
  int j;
  int *bc;
  int k;
  StateDescriptor *d;
  StateRange *r;
  int *bci;
  int k_00;
  int local_48;
  int local_44;
  int local_34;
  long local_28;
  long local_20;
  
  if (*(void **)(in_RDI + 0x98) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0x98));
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(*(int *)(in_RDI + 0x80) * 6);
  __n = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    __n = 0xffffffffffffffff;
  }
  this_00 = (StateDescriptor *)operator_new__(__n);
  memset(this_00,0,__n);
  *(StateDescriptor **)(in_RDI + 0x98) = this_00;
  local_20 = *(long *)(in_RDI + 0x98);
  for (local_28 = *(long *)(in_RDI + 0x88); local_28 != 0; local_28 = *(long *)(local_28 + 0x10)) {
    k_00 = (int)(__n >> 0x20);
    DescriptorList::operator[]((DescriptorList *)this_00,k_00);
    for (local_34 = 0; local_34 < *(int *)(local_28 + 8); local_34 = local_34 + 1) {
      pBVar2 = StateDescriptor::getBC(this_00,k_00);
      for (local_44 = 0; local_44 < 3; local_44 = local_44 + 1) {
        *(int *)(local_20 + (long)local_44 * 4) = pBVar2->bc[local_44];
      }
      for (local_48 = 0; local_48 < 3; local_48 = local_48 + 1) {
        *(int *)(local_20 + 0xc + (long)local_48 * 4) = pBVar2->bc[local_48 + 3];
      }
      local_20 = local_20 + 0x18;
    }
  }
  return;
}

Assistant:

void
DeriveRec::buildBC3D (const DescriptorList& d_list)
{
    BL_ASSERT(nsr > 0);
    delete [] bcr3D;
    bcr3D = new int[2*3*n_state]();
    int* bci = bcr3D;
    for (DeriveRec::StateRange* r = rng; r != 0; r = r->next)
    {
        const StateDescriptor& d = d_list[r->typ];

        for (int k = 0; k < r->nc; k++)
        {
            const int* bc = d.getBC(r->sc + k).vect();

            for (int j = 0; j < AMREX_SPACEDIM; j++)
            {
                bci[j] = bc[j];
            }
            bci += 3;
            for (int j = 0; j < AMREX_SPACEDIM; j++)
            {
                bci[j] = bc[AMREX_SPACEDIM+j];
            }
            bci += 3;
        }
    }
}